

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O2

string * __thiscall
Assimp::FBX::FBXConverter::FixNodeName
          (string *__return_storage_ptr__,FBXConverter *this,string *name)

{
  bool bVar1;
  string *temp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::substr((ulong)&local_40,(ulong)name);
  bVar1 = std::operator==(&local_40,"Model::");
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)name);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)name);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FBXConverter::FixNodeName(const std::string& name) {
            // strip Model:: prefix, avoiding ambiguities (i.e. don't strip if
            // this causes ambiguities, well possible between empty identifiers,
            // such as "Model::" and ""). Make sure the behaviour is consistent
            // across multiple calls to FixNodeName().
            if (name.substr(0, 7) == "Model::") {
                std::string temp = name.substr(7);
                return temp;
            }

            return name;
        }